

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O2

void __thiscall
leveldb::VersionEdit::AddFile
          (VersionEdit *this,int level,uint64_t file,uint64_t file_size,InternalKey *smallest,
          InternalKey *largest)

{
  undefined1 local_d0 [24];
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  pair<int,_leveldb::FileMetaData> local_78;
  
  local_d0._0_4_ = 0;
  local_d0._4_4_ = 0x40000000;
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98._M_p = (pointer)&local_88;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_d0._8_8_ = file;
  local_d0._16_8_ = file_size;
  std::__cxx11::string::_M_assign((string *)&local_b8);
  std::__cxx11::string::_M_assign((string *)&local_98);
  local_78.first = level;
  FileMetaData::FileMetaData(&local_78.second,(FileMetaData *)local_d0);
  std::
  vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
  ::emplace_back<std::pair<int,leveldb::FileMetaData>>
            ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
              *)&this->new_files_,&local_78);
  FileMetaData::~FileMetaData(&local_78.second);
  FileMetaData::~FileMetaData((FileMetaData *)local_d0);
  return;
}

Assistant:

void AddFile(int level, uint64_t file, uint64_t file_size,
               const InternalKey& smallest, const InternalKey& largest) {
    FileMetaData f;
    f.number = file;
    f.file_size = file_size;
    f.smallest = smallest;
    f.largest = largest;
    new_files_.push_back(std::make_pair(level, f));
  }